

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O1

bool __thiscall
flatbuffers::ServiceDef::Deserialize(ServiceDef *this,Parser *parser,Service *service)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  _Rb_tree_header *p_Var3;
  uint uVar4;
  pointer pcVar5;
  bool bVar6;
  ushort uVar7;
  ushort uVar8;
  RPCCall *this_00;
  Service *pSVar9;
  Vector<flatbuffers::Offset<reflection::KeyValue>,_unsigned_int> *attrs;
  unsigned_short vtsize;
  ulong uVar10;
  Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int> *documentation;
  long lVar11;
  uint uVar12;
  string local_70;
  string local_50;
  
  if (*(ushort *)(service + -(long)*(int *)service) < 5) {
    uVar7 = 0;
  }
  else {
    uVar7 = *(ushort *)(service + (4 - (long)*(int *)service));
  }
  uVar10 = (ulong)uVar7;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_70,service + *(uint *)(service + uVar10) + uVar10 + 4,
             service + (ulong)*(uint *)(service + *(uint *)(service + uVar10) + uVar10) +
                       *(uint *)(service + uVar10) + uVar10 + 4);
  Parser::UnqualifiedName(&local_50,parser,&local_70);
  std::__cxx11::string::operator=((string *)this,(string *)&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((6 < *(ushort *)(service + -(long)*(int *)service)) &&
     (*(short *)(service + (6 - (long)*(int *)service)) != 0)) {
    uVar10 = 0xffffffffffffffff;
    uVar12 = 0;
    do {
      lVar11 = -(long)*(int *)service;
      uVar7 = *(ushort *)(service + -(long)*(int *)service);
      if (uVar7 < 7) {
        uVar8 = 0;
      }
      else {
        uVar8 = *(ushort *)(service + lVar11 + 6);
      }
      uVar10 = uVar10 + 1;
      uVar4 = *(uint *)(service + (ulong)*(uint *)(service + uVar8) + (ulong)uVar8);
      if (uVar4 <= uVar10) goto LAB_001252d4;
      this_00 = (RPCCall *)operator_new(0xd8);
      uVar8 = 0;
      memset(this_00,0,0xd8);
      paVar1 = &(this_00->super_Definition).name.field_2;
      paVar2 = &(this_00->super_Definition).file.field_2;
      p_Var3 = &(this_00->super_Definition).attributes.dict._M_t._M_impl.super__Rb_tree_header;
      (this_00->super_Definition).name._M_dataplus._M_p = (pointer)paVar1;
      (this_00->super_Definition).name._M_string_length = 0;
      (this_00->super_Definition).name.field_2._M_local_buf[0] = '\0';
      (this_00->super_Definition).file._M_dataplus._M_p = (pointer)paVar2;
      (this_00->super_Definition).file._M_string_length = 0;
      (this_00->super_Definition).file.field_2._M_local_buf[0] = '\0';
      (this_00->super_Definition).doc_comment.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (this_00->super_Definition).doc_comment.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (this_00->super_Definition).doc_comment.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (this_00->super_Definition).attributes.dict._M_t._M_impl.super__Rb_tree_header._M_header.
      _M_color = _S_red;
      *(_Base_ptr *)
       ((long)&(this_00->super_Definition).attributes.dict._M_t._M_impl.super__Rb_tree_header.
               _M_header + 8) = (_Base_ptr)0x0;
      *(_Rb_tree_header **)
       ((long)&(this_00->super_Definition).attributes.dict._M_t._M_impl.super__Rb_tree_header.
               _M_header + 0x10) = p_Var3;
      *(_Rb_tree_header **)
       ((long)&(this_00->super_Definition).attributes.dict._M_t._M_impl.super__Rb_tree_header.
               _M_header + 0x18) = p_Var3;
      (this_00->super_Definition).defined_namespace = (Namespace *)0x0;
      (this_00->super_Definition).serialized_location = 0;
      (this_00->super_Definition).attributes.dict._M_t._M_impl.super__Rb_tree_header._M_node_count =
           0;
      (this_00->super_Definition).attributes.vec.
      super__Vector_base<flatbuffers::Value_*,_std::allocator<flatbuffers::Value_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (this_00->super_Definition).attributes.vec.
      super__Vector_base<flatbuffers::Value_*,_std::allocator<flatbuffers::Value_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (this_00->super_Definition).attributes.vec.
      super__Vector_base<flatbuffers::Value_*,_std::allocator<flatbuffers::Value_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (this_00->super_Definition).generated = false;
      (this_00->super_Definition).index = -1;
      (this_00->super_Definition).refcount = 1;
      (this_00->super_Definition).declaration_file = (string *)0x0;
      if (6 < uVar7) {
        uVar8 = *(ushort *)(service + lVar11 + 6);
      }
      if (uVar8 == 0) {
        pSVar9 = (Service *)0x0;
      }
      else {
        pSVar9 = service + (ulong)*(uint *)(service + uVar8) + (ulong)uVar8;
      }
      if (*(uint *)pSVar9 <= uVar10) {
        __assert_fail("i < size()",
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/include/flatbuffers/vector.h"
                      ,0xc1,
                      "return_type flatbuffers::Vector<flatbuffers::Offset<reflection::RPCCall>>::Get(SizeT) const [T = flatbuffers::Offset<reflection::RPCCall>, SizeT = unsigned int]"
                     );
      }
      bVar6 = RPCCall::Deserialize
                        (this_00,parser,
                         (RPCCall *)
                         (pSVar9 + (ulong)*(uint *)(pSVar9 + (ulong)uVar12 + 4) + (ulong)uVar12 + 4)
                        );
      if (!bVar6) break;
      uVar12 = uVar12 + 4;
      bVar6 = SymbolTable<flatbuffers::RPCCall>::Add(&this->calls,(string *)this_00,this_00);
    } while (!bVar6);
    SymbolTable<flatbuffers::Value>::~SymbolTable(&(this_00->super_Definition).attributes);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&(this_00->super_Definition).doc_comment);
    pcVar5 = (this_00->super_Definition).file._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar5 != paVar2) {
      operator_delete(pcVar5,paVar2->_M_allocated_capacity + 1);
    }
    pcVar5 = (this_00->super_Definition).name._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar5 != paVar1) {
      operator_delete(pcVar5,paVar1->_M_allocated_capacity + 1);
    }
    operator_delete(this_00,0xd8);
    if (uVar10 < uVar4) {
      return false;
    }
  }
LAB_001252d4:
  if (*(ushort *)(service + -(long)*(int *)service) < 9) {
    uVar7 = 0;
  }
  else {
    uVar7 = *(ushort *)(service + (8 - (long)*(int *)service));
  }
  if (uVar7 == 0) {
    attrs = (Vector<flatbuffers::Offset<reflection::KeyValue>,_unsigned_int> *)0x0;
  }
  else {
    attrs = (Vector<flatbuffers::Offset<reflection::KeyValue>,_unsigned_int> *)
            (service + (ulong)*(uint *)(service + uVar7) + (ulong)uVar7);
  }
  bVar6 = DeserializeAttributesCommon(&(this->super_Definition).attributes,parser,attrs);
  if (!bVar6) {
    return false;
  }
  if (*(ushort *)(service + -(long)*(int *)service) < 0xb) {
    uVar7 = 0;
  }
  else {
    uVar7 = *(ushort *)(service + (10 - (long)*(int *)service));
  }
  if (uVar7 == 0) {
    documentation = (Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int> *)0x0;
  }
  else {
    documentation =
         (Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int> *)
         (service + (ulong)*(uint *)(service + uVar7) + (ulong)uVar7);
  }
  anon_unknown_0::DeserializeDoc(&(this->super_Definition).doc_comment,documentation);
  return true;
}

Assistant:

bool ServiceDef::Deserialize(Parser &parser,
                             const reflection::Service *service) {
  name = parser.UnqualifiedName(service->name()->str());
  if (service->calls()) {
    for (uoffset_t i = 0; i < service->calls()->size(); ++i) {
      auto call = new RPCCall();
      if (!call->Deserialize(parser, service->calls()->Get(i)) ||
          calls.Add(call->name, call)) {
        delete call;
        return false;
      }
    }
  }
  if (!DeserializeAttributes(parser, service->attributes())) return false;
  DeserializeDoc(doc_comment, service->documentation());
  return true;
}